

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_check_magic.c
# Opt level: O0

void write_all_states(char *buff,uint states)

{
  uint s;
  char *__src;
  uint local_14;
  uint lowbit;
  uint states_local;
  char *buff_local;
  
  *buff = '\0';
  local_14 = states;
  while (s = local_14 & (local_14 ^ 0xffffffff) + 1, s != 0) {
    local_14 = (s ^ 0xffffffff) & local_14;
    __src = state_name(s);
    strcat(buff,__src);
    if (local_14 != 0) {
      strcat(buff,"/");
    }
  }
  return;
}

Assistant:

static void
write_all_states(char *buff, unsigned int states)
{
	unsigned int lowbit;

	*buff = '\0';

	/* A trick for computing the lowest set bit. */
	while ((lowbit = states & (1 + ~states)) != 0) {
		states &= ~lowbit;		/* Clear the low bit. */
		strcat(buff, state_name(lowbit));
		if (states != 0)
			strcat(buff, "/");
	}
}